

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

int __thiscall QTabBar::insertTab(QTabBar *this,int index,QIcon *icon,QString *text)

{
  long lVar1;
  QTabBarPrivate *this_00;
  Data *pDVar2;
  void **ppvVar3;
  long lVar4;
  Tab **ppTVar5;
  long lVar6;
  long *plVar7;
  int iVar8;
  ButtonPosition position;
  QStyle *pQVar9;
  QWidget *widget;
  undefined4 *puVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  Connection local_100;
  code *local_f8;
  ImplFn local_f0;
  code *local_e8;
  undefined8 local_e0;
  QStyleOptionTab opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((index < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)(uint)index)) {
    index = (int)(this_00->tabList).d.size;
    opt.super_QStyleOption._0_8_ = operator_new(0xf0);
    pDVar2 = (text->d).d;
    *(Data **)opt.super_QStyleOption._0_8_ = pDVar2;
    *(char16_t **)(opt.super_QStyleOption._0_8_ + 8) = (text->d).ptr;
    *(qsizetype *)(opt.super_QStyleOption._0_8_ + 0x10) = (text->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(long *)(opt.super_QStyleOption._0_8_ + 0x48) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x50) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x38) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x40) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x28) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x30) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x18) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x20) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x58) = 0;
    QIcon::QIcon((QIcon *)(opt.super_QStyleOption._0_8_ + 0x60),icon);
    *(long *)(opt.super_QStyleOption._0_8_ + 0x68) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x70) = -1;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x78) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x80) = -1;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x88) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x90) = -1;
    *(undefined4 *)(opt.super_QStyleOption._0_8_ + 0x98) = 0;
    *(undefined2 *)(opt.super_QStyleOption._0_8_ + 0x9c) = 0xffff;
    *(undefined8 *)(opt.super_QStyleOption._0_8_ + 0x9e) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xa8) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xb0) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xb8) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xc0) = 2;
    *(long *)(opt.super_QStyleOption._0_8_ + 200) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xd0) = 0;
    *(undefined4 *)(opt.super_QStyleOption._0_8_ + 0xd8) = 0;
    *(undefined8 *)(opt.super_QStyleOption._0_8_ + 0xdc) = 0xffffffff;
    *(byte *)(opt.super_QStyleOption._0_8_ + 0xe4) =
         *(byte *)(opt.super_QStyleOption._0_8_ + 0xe4) & 0xf8 | 3;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xe8) = 0;
    QtPrivate::QPodArrayOps<QTabBarPrivate::Tab*>::emplace<QTabBarPrivate::Tab*&>
              ((QPodArrayOps<QTabBarPrivate::Tab*> *)&this_00->tabList,(this_00->tabList).d.size,
               (Tab **)&opt);
    QList<QTabBarPrivate::Tab_*>::end(&this_00->tabList);
  }
  else {
    opt.super_QStyleOption._0_8_ = operator_new(0xf0);
    pDVar2 = (text->d).d;
    *(Data **)opt.super_QStyleOption._0_8_ = pDVar2;
    *(char16_t **)(opt.super_QStyleOption._0_8_ + 8) = (text->d).ptr;
    *(qsizetype *)(opt.super_QStyleOption._0_8_ + 0x10) = (text->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(long *)(opt.super_QStyleOption._0_8_ + 0x48) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x50) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x38) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x40) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x28) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x30) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x18) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x20) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x58) = 0;
    QIcon::QIcon((QIcon *)(opt.super_QStyleOption._0_8_ + 0x60),icon);
    *(long *)(opt.super_QStyleOption._0_8_ + 0x68) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x70) = -1;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x78) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x80) = -1;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x88) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0x90) = -1;
    *(undefined4 *)(opt.super_QStyleOption._0_8_ + 0x98) = 0;
    *(undefined2 *)(opt.super_QStyleOption._0_8_ + 0x9c) = 0xffff;
    *(undefined8 *)(opt.super_QStyleOption._0_8_ + 0x9e) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xa8) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xb0) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xb8) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xc0) = 2;
    *(long *)(opt.super_QStyleOption._0_8_ + 200) = 0;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xd0) = 0;
    *(undefined4 *)(opt.super_QStyleOption._0_8_ + 0xd8) = 0;
    *(undefined8 *)(opt.super_QStyleOption._0_8_ + 0xdc) = 0xffffffff;
    *(byte *)(opt.super_QStyleOption._0_8_ + 0xe4) =
         *(byte *)(opt.super_QStyleOption._0_8_ + 0xe4) & 0xf8 | 3;
    *(long *)(opt.super_QStyleOption._0_8_ + 0xe8) = 0;
    QtPrivate::QPodArrayOps<QTabBarPrivate::Tab*>::emplace<QTabBarPrivate::Tab*&>
              ((QPodArrayOps<QTabBarPrivate::Tab*> *)&this_00->tabList,(ulong)(uint)index,
               (Tab **)&opt);
    QList<QTabBarPrivate::Tab_*>::begin(&this_00->tabList);
  }
  QKeySequence::mnemonic((QString *)&opt);
  iVar8 = QWidget::grabShortcut(&this->super_QWidget,(QKeySequence *)&opt,WindowShortcut);
  (this_00->tabList).d.ptr[index]->shortcutId = iVar8;
  QKeySequence::~QKeySequence((QKeySequence *)&opt);
  iVar8 = this_00->firstVisible;
  if (index < this_00->firstVisible) {
    iVar8 = index;
  }
  iVar11 = 0;
  if (0 < iVar8) {
    iVar11 = iVar8;
  }
  this_00->firstVisible = iVar11;
  QTabBarPrivate::refresh(this_00);
  if ((this_00->tabList).d.size == 1) {
    setCurrentIndex(this,index);
  }
  else if (index <= this_00->currentIndex) {
    this_00->currentIndex = this_00->currentIndex + 1;
  }
  iVar8 = this_00->lastVisible + 1;
  if (this_00->lastVisible < index) {
    iVar8 = index;
  }
  this_00->lastVisible = iVar8;
  if ((this_00->field_0x2d0 & 0x40) != 0) {
    memset(&opt,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab(&opt);
    (**(code **)(*(long *)&this->super_QWidget + 0x1c8))(this,&opt,index);
    pQVar9 = QWidget::style(&this->super_QWidget);
    position = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x5c,0,this,0);
    widget = (QWidget *)operator_new(0x28);
    anon_unknown.dwarf_10d2268::CloseButton::CloseButton((CloseButton *)widget,&this->super_QWidget)
    ;
    local_e8 = QAbstractButton::clicked;
    local_e0 = 0;
    local_f8 = QTabBarPrivate::closeTab;
    local_f0 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
    puVar10 = (undefined4 *)operator_new(0x20);
    *puVar10 = 1;
    *(code **)(puVar10 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QTabBarPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar10 + 4) = QTabBarPrivate::closeTab;
    *(undefined8 *)(puVar10 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_100,(void **)widget,(QObject *)&local_e8,ppvVar3,
               (QSlotObjectBase *)&local_f8,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_100);
    setTabButton(this,index,position,widget);
    QIcon::~QIcon(&opt.icon);
    if (opt.text.d.d != (Data *)0x0) {
      LOCK();
      ((opt.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((opt.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((opt.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(opt.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  lVar4 = (this_00->tabList).d.size;
  if (lVar4 != 0) {
    ppTVar5 = (this_00->tabList).d.ptr;
    lVar12 = 0;
    do {
      lVar6 = *(long *)((long)ppTVar5 + lVar12);
      iVar8 = *(int *)(lVar6 + 0xdc);
      if (index <= iVar8) {
        *(int *)(lVar6 + 0xdc) = iVar8 + 1;
      }
      lVar12 = lVar12 + 8;
    } while (lVar4 << 3 != lVar12);
  }
  iVar8 = tabAt(this,&this_00->mousePosition);
  if (iVar8 == index) {
    this_00->hoverIndex = index;
    QVar13 = tabRect(this,index);
    *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar13;
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,index);
  if ((this_00->field_0x2d1 & 8) != 0) {
    plVar7 = *(long **)&(this_00->super_QWidgetPrivate).field_0x8;
    (**(code **)(*plVar7 + 0x68))(plVar7,1 < *(int *)(plVar7[1] + 0x2e8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return index;
  }
  __stack_chk_fail();
}

Assistant:

int QTabBar::insertTab(int index, const QIcon& icon, const QString &text)
{
    Q_D(QTabBar);
    if (!d->validIndex(index)) {
        index = d->tabList.size();
        d->tabList.append(new QTabBarPrivate::Tab(icon, text));
    } else {
        d->tabList.insert(index, new QTabBarPrivate::Tab(icon, text));
    }
#ifndef QT_NO_SHORTCUT
    d->tabList.at(index)->shortcutId = grabShortcut(QKeySequence::mnemonic(text));
#endif
    d->firstVisible = qMax(qMin(index, d->firstVisible), 0);
    d->refresh();
    if (d->tabList.size() == 1)
        setCurrentIndex(index);
    else if (index <= d->currentIndex)
        ++d->currentIndex;

    if (index <= d->lastVisible)
        ++d->lastVisible;
    else
        d->lastVisible = index;

    if (d->closeButtonOnTabs) {
        QStyleOptionTab opt;
        initStyleOption(&opt, index);
        ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
        QAbstractButton *closeButton = new CloseButton(this);
        QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                d, &QTabBarPrivate::closeTab);
        setTabButton(index, closeSide, closeButton);
    }

    for (const auto tab : std::as_const(d->tabList)) {
        if (tab->lastTab >= index)
            ++tab->lastTab;
    }

    if (tabAt(d->mousePosition) == index) {
        d->hoverIndex = index;
        d->hoverRect = tabRect(index);
    }

    tabInserted(index);
    d->autoHideTabs();
    return index;
}